

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

bool Imath_2_5::extractSHRT<float>
               (Matrix44<float> *mat,Vec3<float> *s,Vec3<float> *h,Vec3<float> *r,Vec3<float> *t,
               bool exc,Order rOrder)

{
  bool bVar1;
  float *pfVar2;
  Vec3<float> *in_RCX;
  Matrix44<float> *in_RDI;
  float *in_R8;
  int in_stack_00000008;
  Euler<float> e;
  Euler<float> eXYZ;
  Matrix44<float> rot;
  Vec3<float> *in_stack_000000d8;
  Matrix44<float> *in_stack_000000e0;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  Vec3<float> *in_stack_ffffffffffffff68;
  Euler<float> *in_stack_ffffffffffffff70;
  Order in_stack_ffffffffffffff84;
  Euler<float> *in_stack_ffffffffffffff88;
  Euler<float> *in_stack_ffffffffffffff90;
  bool local_1;
  
  Matrix44<float>::Matrix44
            ((Matrix44<float> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  Matrix44<float>::operator=((Matrix44<float> *)&stack0xffffffffffffff8c,in_RDI);
  bVar1 = extractAndRemoveScalingAndShear<float>
                    ((Matrix44<float> *)rot.x[2]._4_8_,(Vec3<float> *)rot.x._28_8_,
                     (Vec3<float> *)rot.x[1]._4_8_,rot.x[1][0]._3_1_);
  if (bVar1) {
    extractEulerXYZ<float>(in_stack_000000e0,in_stack_000000d8);
    pfVar2 = Matrix44<float>::operator[](in_RDI,3);
    *in_R8 = *pfVar2;
    pfVar2 = Matrix44<float>::operator[](in_RDI,3);
    in_R8[1] = pfVar2[1];
    pfVar2 = Matrix44<float>::operator[](in_RDI,3);
    in_R8[2] = pfVar2[2];
    if (in_stack_00000008 != 0x101) {
      Euler<float>::Euler(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          (Order)in_stack_ffffffffffffff64,(InputLayout)in_stack_ffffffffffffff60);
      Euler<float>::Euler(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                          in_stack_ffffffffffffff84);
      Euler<float>::toXYZVector(in_stack_ffffffffffffff88);
      Vec3<float>::operator=(in_RCX,(Vec3<float> *)&stack0xffffffffffffff60);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool 
extractSHRT (const Matrix44<T> &mat,
	     Vec3<T> &s,
	     Vec3<T> &h,
	     Vec3<T> &r,
	     Vec3<T> &t,
	     bool exc /* = true */ ,
	     typename Euler<T>::Order rOrder /* = Euler<T>::XYZ */ )
{
    Matrix44<T> rot;

    rot = mat;
    if (! extractAndRemoveScalingAndShear (rot, s, h, exc))
	return false;

    extractEulerXYZ (rot, r);

    t.x = mat[3][0];
    t.y = mat[3][1];
    t.z = mat[3][2];

    if (rOrder != Euler<T>::XYZ)
    {
	IMATH_INTERNAL_NAMESPACE::Euler<T> eXYZ (r, IMATH_INTERNAL_NAMESPACE::Euler<T>::XYZ);
	IMATH_INTERNAL_NAMESPACE::Euler<T> e (eXYZ, rOrder);
	r = e.toXYZVector ();
    }

    return true;
}